

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

void * StateLegalMoves(pyhanabi_state_t *state)

{
  HanabiState *this;
  void *pvVar1;
  long *in_RDI;
  vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_> *list;
  HanabiState *hanabi_state;
  int in_stack_00000044;
  HanabiState *in_stack_00000048;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x1aa,"void *StateLegalMoves(pyhanabi_state_t *)");
  }
  if (*in_RDI != 0) {
    this = (HanabiState *)*in_RDI;
    pvVar1 = operator_new(0x18);
    hanabi_learning_env::HanabiState::CurPlayer(this);
    hanabi_learning_env::HanabiState::LegalMoves(in_stack_00000048,in_stack_00000044);
    return pvVar1;
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x1ab,"void *StateLegalMoves(pyhanabi_state_t *)");
}

Assistant:

void* StateLegalMoves(pyhanabi_state_t* state) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  auto hanabi_state =
      reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state);
  std::vector<hanabi_learning_env::HanabiMove>* list =
      new std::vector<hanabi_learning_env::HanabiMove>(
          hanabi_state->LegalMoves(hanabi_state->CurPlayer()));
  return static_cast<void*>(list);
}